

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O2

size_t al_fwrite16be(ALLEGRO_FILE *f,int16_t w)

{
  uint uVar1;
  size_t sVar2;
  uint c;
  
  c = (uint)(byte)((ushort)w >> 8);
  uVar1 = al_fputc(f,c);
  if (uVar1 == c) {
    uVar1 = al_fputc(f,(ushort)w & 0xff);
    sVar2 = (ulong)(uVar1 == ((ushort)w & 0xff)) + 1;
  }
  else {
    sVar2 = 0;
  }
  return sVar2;
}

Assistant:

size_t al_fwrite16be(ALLEGRO_FILE *f, int16_t w)
{
   uint8_t b1, b2;
   ASSERT(f);

   b1 = (w & 0xFF00) >> 8;
   b2 = w & 0x00FF;

   if (al_fputc(f, b1) == b1) {
      if (al_fputc(f, b2) == b2) {
         return 2;
      }
      return 1;
   }
   return 0;
}